

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O0

void MyGame_Example_Any_print_json_union_type(flatcc_json_printer_t *ctx,flatbuffers_utype_t type)

{
  flatbuffers_utype_t type_local;
  flatcc_json_printer_t *ctx_local;
  
  switch(type) {
  case '\x01':
    flatcc_json_printer_enum(ctx,"Monster",7);
    break;
  case '\x02':
    flatcc_json_printer_enum(ctx,"TestSimpleTableWithEnum",0x17);
    break;
  case '\x03':
    flatcc_json_printer_enum(ctx,"Monster2",8);
    break;
  case '\x04':
    flatcc_json_printer_enum(ctx,"Alt",3);
    break;
  default:
    flatcc_json_printer_enum(ctx,"NONE",4);
  }
  return;
}

Assistant:

static void MyGame_Example_Any_print_json_union_type(flatcc_json_printer_t *ctx, flatbuffers_utype_t type)
{
    switch (type) {
    case 1:
        flatcc_json_printer_enum(ctx, "Monster", 7);
        break;
    case 2:
        flatcc_json_printer_enum(ctx, "TestSimpleTableWithEnum", 23);
        break;
    case 3:
        flatcc_json_printer_enum(ctx, "Monster2", 8);
        break;
    case 4:
        flatcc_json_printer_enum(ctx, "Alt", 3);
        break;
    default:
        flatcc_json_printer_enum(ctx, "NONE", 4);
        break;
    }
}